

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O1

int math_abs(lua_State *L)

{
  int iVar1;
  lua_Integer lVar2;
  long n;
  lua_Number lVar3;
  
  iVar1 = lua_isinteger(L,1);
  if (iVar1 == 0) {
    lVar3 = luaL_checknumber(L,1);
    lua_pushnumber(L,ABS(lVar3));
  }
  else {
    lVar2 = lua_tointegerx(L,1,(int *)0x0);
    n = -lVar2;
    if (0 < lVar2) {
      n = lVar2;
    }
    lua_pushinteger(L,n);
  }
  return 1;
}

Assistant:

static int math_abs(lua_State *L) {
    if (lua_isinteger(L, 1)) {
        lua_Integer n = lua_tointeger(L, 1);
        if (n < 0) n = (lua_Integer) (0u - (lua_Unsigned) n);
        lua_pushinteger(L, n);
    } else
        lua_pushnumber(L, l_mathop(fabs)(luaL_checknumber(L, 1)));
    return 1;
}